

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

void __thiscall QVariant::save(QVariant *this,QDataStream *s)

{
  uint uVar1;
  PrivateShared *pPVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  ushort *puVar9;
  QVariant *data;
  long in_FS_OFFSET;
  bool bVar10;
  QMetaType local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = *(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc;
  local_58._0_4_ = (undefined4)uVar6;
  local_58._4_4_ = (undefined4)(uVar6 >> 0x20);
  uVar3 = QMetaType::registerHelper((QMetaType *)&local_58.shared);
  bVar10 = 0xffff < uVar3;
  uVar5 = 0x10000;
  if (!bVar10) {
    uVar5 = uVar3;
  }
  uVar1 = s->ver;
  if ((int)uVar1 < 0x14) {
    if (uVar3 < 0x10000) {
      if ((uVar3 & 0xfff8) == 0x38) {
        uVar5 = 0x400;
        goto LAB_002a3e78;
      }
      if (uVar3 - 0x1000 < 0x18) {
        uVar5 = uVar3 - 0xfc0;
        bVar10 = false;
      }
      else {
        uVar5 = 0x79;
        if (uVar3 != 0x2000) {
          uVar5 = uVar3;
        }
        bVar10 = false;
      }
    }
    else {
      iVar4 = strcmp(*(char **)((*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc) + 0x18),
                     "QRegExp");
      uVar5 = 0x400;
      if (iVar4 == 0) {
        uVar5 = 0x1b;
      }
LAB_002a3e78:
      bVar10 = true;
    }
    if ((int)uVar1 < 7) {
      puVar9 = mapIdFromQt3ToCurrent;
      for (lVar7 = 0; lVar7 != 0x24; lVar7 = lVar7 + 1) {
        if (uVar5 == *puVar9) {
          uVar5 = (uint)lVar7;
          if (bVar10) goto LAB_002a3f4e;
          pcVar8 = (char *)0x0;
          goto LAB_002a3f7d;
        }
        puVar9 = puVar9 + 1;
      }
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_4_ = 0;
      local_58._20_4_ = 0;
      local_40 = (char *)0x2;
      save((QVariant *)&local_58,s);
      ~QVariant((QVariant *)&local_58);
      goto LAB_002a403f;
    }
    if (0xc < uVar1) goto LAB_002a3f4a;
    if (uVar5 == 0x400) {
      uVar5 = 0x7f;
    }
    else {
      if (uVar5 - 0x1f < 0x19) {
        uVar5 = uVar5 + 0x61;
      }
      else {
        if (uVar5 == 0x79) {
          uVar5 = 0x4b;
          goto LAB_002a3f4a;
        }
        if (uVar5 - 0x4b < 0xb) {
          uVar5 = uVar5 + 1;
        }
        else {
          bVar10 = (bool)(bVar10 | (uVar5 == 0x1e || 0x55 < uVar5));
          if (uVar5 == 0x1e || 0x55 < uVar5) {
            uVar5 = 0x7f;
          }
        }
      }
      if (!bVar10) goto LAB_002a3f7a;
    }
    uVar6 = *(ulong *)&(this->d).field_0x18;
LAB_002a3f57:
    pcVar8 = QtMetaTypePrivate::typedefNameForType
                       ((QMetaTypeInterface *)(uVar6 & 0xfffffffffffffffc));
    if (pcVar8 == (char *)0x0) {
      uVar6 = *(ulong *)&(this->d).field_0x18;
LAB_002a3f6e:
      if ((uVar6 & 0xfffffffffffffffc) == 0) goto LAB_002a3f7a;
      pcVar8 = *(char **)((uVar6 & 0xfffffffffffffffc) + 0x18);
    }
  }
  else {
LAB_002a3f4a:
    if (bVar10) {
LAB_002a3f4e:
      uVar6 = *(ulong *)&(this->d).field_0x18;
      if ((int)uVar1 < 0x14) goto LAB_002a3f57;
      goto LAB_002a3f6e;
    }
LAB_002a3f7a:
    pcVar8 = (char *)0x0;
  }
LAB_002a3f7d:
  QDataStream::operator<<(s,uVar5);
  if (7 < s->ver) {
    QDataStream::operator<<(s,(byte)(this->d).field_0x18 >> 1 & 1);
  }
  if (pcVar8 != (char *)0x0) {
    QDataStream::operator<<(s,pcVar8);
  }
  uVar6 = *(ulong *)&(this->d).field_0x18;
  if (uVar6 < 4) {
    if (s->ver < 0xd) {
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_4_ = 0;
      local_58._20_4_ = 0;
      ::operator<<(s,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
  }
  else {
    local_58._0_4_ = (undefined4)(uVar6 & 0xfffffffffffffffc);
    local_58._4_4_ = (undefined4)((uVar6 & 0xfffffffffffffffc) >> 0x20);
    data = this;
    if ((uVar6 & 1) != 0) {
      pPVar2 = (this->d).data.shared;
      data = (QVariant *)
             ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar2->offset);
    }
    bVar10 = QMetaType::save((QMetaType *)&local_58.shared,s,data);
    if (!bVar10) {
      local_58._0_4_ = 2;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_4_ = 0;
      local_58._20_4_ = 0;
      local_40 = "default";
      local_60.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
      if (local_60.d_ptr == (QMetaTypeInterface *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = (local_60.d_ptr)->name;
      }
      uVar5 = QMetaType::registerHelper(&local_60);
      QMessageLogger::warning
                ((QMessageLogger *)&local_58,
                 "QVariant::save: unable to save type \'%s\' (type id: %d).\n",pcVar8,(ulong)uVar5);
    }
  }
LAB_002a403f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariant::save(QDataStream &s) const
{
    quint32 typeId = d.type().id();
    bool saveAsUserType = false;
    if (typeId >= QMetaType::User) {
        typeId = QMetaType::User;
        saveAsUserType = true;
    }
    if (s.version() < QDataStream::Qt_6_0) {
        // map to Qt 5 values
        if (typeId == QMetaType::User) {
            typeId = Qt5UserType;
            if (!strcmp(d.type().name(), "QRegExp")) {
                typeId = 27; // QRegExp in Qt 4/5
            }
        } else if (typeId > Qt5LastCoreType && typeId <= QMetaType::LastCoreType) {
            // the type didn't exist in Qt 5
            typeId = Qt5UserType;
            saveAsUserType = true;
        } else if (typeId >= QMetaType::FirstGuiType && typeId <= QMetaType::LastGuiType) {
            typeId -= Qt6ToQt5GuiTypeDelta;
            if (typeId > Qt5LastGuiType) {
                typeId = Qt5UserType;
                saveAsUserType = true;
            }
        } else if (typeId == QMetaType::QSizePolicy) {
            typeId = Qt5SizePolicy;
        }
    }
    if (s.version() < QDataStream::Qt_4_0) {
        int i;
        for (i = 0; i <= MapFromThreeCount - 1; ++i) {
            if (mapIdFromQt3ToCurrent[i] == typeId) {
                typeId = i;
                break;
            }
        }
        if (i >= MapFromThreeCount) {
            s << QVariant();
            return;
        }
    } else if (s.version() < QDataStream::Qt_5_0) {
        if (typeId == Qt5UserType) {
            typeId = 127; // QVariant::UserType had this value in Qt4
            saveAsUserType = true;
        } else if (typeId >= 128 - 97 && typeId <= Qt5LastCoreType) {
            // In Qt4 id == 128 was FirstExtCoreType. In Qt5 ExtCoreTypes set was merged to CoreTypes
            // by moving all ids down by 97.
            typeId += 97;
        } else if (typeId == Qt5SizePolicy) {
            typeId = 75;
        } else if (typeId >= Qt5KeySequence && typeId <= Qt5QQuaternion) {
            // and as a result these types received lower ids too
            typeId += 1;
        } else if (typeId > Qt5QQuaternion || typeId == QMetaType::QUuid) {
            // These existed in Qt 4 only as a custom type
            typeId = 127;
            saveAsUserType = true;
        }
    }
    const char *typeName = nullptr;
    if (saveAsUserType) {
        if (s.version() < QDataStream::Qt_6_0)
            typeName = QtMetaTypePrivate::typedefNameForType(d.type().d_ptr);
        if (!typeName)
            typeName = d.type().name();
    }
    s << typeId;
    if (s.version() >= QDataStream::Qt_4_2)
        s << qint8(d.is_null);
    if (typeName)
        s << typeName;

    if (!isValid()) {
        if (s.version() < QDataStream::Qt_5_0)
            s << QString();
        return;
    }

    if (!d.type().save(s, constData())) {
        qWarning("QVariant::save: unable to save type '%s' (type id: %d).\n",
                 d.type().name(), d.type().id());
        Q_ASSERT_X(false, "QVariant::save", "Invalid type to save");
    }
}